

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O1

void __thiscall despot::Tag::PrintObs(Tag *this,State *state,OBS_TYPE obs,ostream *out)

{
  int iVar1;
  undefined8 uVar2;
  ostream *this_00;
  long lVar3;
  char *pcVar4;
  
  iVar1 = despot::Floor::NumCells();
  if ((long)iVar1 == obs) {
    pcVar4 = "On opponent";
    lVar3 = 0xb;
  }
  else {
    uVar2 = despot::Floor::GetCell((int)this + 0x58);
    std::__ostream_insert<char,std::char_traits<char>>(out,"Rob at (",8);
    this_00 = (ostream *)std::ostream::operator<<((ostream *)out,(int)uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    out = (ostream *)std::ostream::operator<<((ostream *)this_00,(int)((ulong)uVar2 >> 0x20));
    pcVar4 = ")";
    lVar3 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void Tag::PrintObs(const State& state, OBS_TYPE obs, ostream& out) const {
	if (obs == floor_.NumCells()) {
		out << "On opponent" << endl;
	} else {
		Coord rob = floor_.GetCell(obs);
		out << "Rob at (" << rob.x << ", " << rob.y << ")" << endl;
	}
}